

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# klvwalk.cpp
# Opt level: O1

void __thiscall CommandOptions::CommandOptions(CommandOptions *this,int argc,char **argv)

{
  FileList_t *pFVar1;
  size_t *psVar2;
  char cVar3;
  FILE *__s1;
  int iVar4;
  _List_node_base *p_Var5;
  char *pcVar6;
  CommandOptions *pCVar7;
  char *pcVar8;
  bool bVar9;
  allocator<char> local_79;
  CommandOptions *local_78;
  bool *local_70;
  FILE *local_68;
  _List_node_base *local_60;
  undefined1 local_58;
  undefined7 uStack_57;
  _List_node_base *p_Stack_50;
  char *local_48;
  char *local_40;
  char **local_38;
  
  this->error_flag = true;
  local_70 = &this->version_flag;
  pFVar1 = &this->inFileList;
  this->version_flag = false;
  this->help_flag = false;
  this->verbose_flag = false;
  this->read_mxf_flag = false;
  this->walk_parts_flag = false;
  this->allow_skip_flag = false;
  (this->inFileList).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)pFVar1;
  (this->inFileList).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)pFVar1;
  (this->inFileList).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = 0;
  bVar9 = 1 < argc;
  pCVar7 = this;
  local_38 = argv;
  if (1 < argc) {
    local_40 = (char *)(ulong)(uint)argc;
    local_48 = (char *)(1 - (long)local_40);
    pcVar8 = (char *)0x2;
    local_78 = this;
    do {
      __s1 = (FILE *)local_38[(long)(pcVar8 + -1)];
      this = (CommandOptions *)__s1;
      iVar4 = strcmp((char *)__s1,"-help");
      if (iVar4 == 0) {
LAB_00106589:
        pCVar7->help_flag = true;
      }
      else if ((char)__s1->_flags == '-') {
        cVar3 = *(char *)((long)&__s1->_flags + 1);
        this = (CommandOptions *)(ulong)(uint)(int)cVar3;
        iVar4 = isalpha((int)cVar3);
        pCVar7 = local_78;
        if ((iVar4 == 0) || (*(char *)((long)&__s1->_flags + 2) != '\0')) {
switchD_0010656e_caseD_71:
          this = (CommandOptions *)_stderr;
          fprintf(_stderr,"Unrecognized option: %s\n",__s1);
          if (bVar9) {
            return;
          }
          break;
        }
        switch(cVar3) {
        case 'p':
          local_78->walk_parts_flag = true;
          break;
        case 'q':
        case 't':
        case 'u':
          goto switchD_0010656e_caseD_71;
        case 'r':
          local_78->read_mxf_flag = true;
          break;
        case 's':
          local_78->allow_skip_flag = true;
          break;
        case 'v':
          local_78->verbose_flag = true;
          break;
        default:
          if (cVar3 != 'V') {
            if (cVar3 == 'h') goto LAB_00106589;
            goto switchD_0010656e_caseD_71;
          }
          *local_70 = true;
        }
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_68,(char *)__s1,&local_79);
        p_Var5 = (_List_node_base *)operator_new(0x30);
        p_Var5[1]._M_next = p_Var5 + 2;
        if (local_68 == (FILE *)&stack0xffffffffffffffa8) {
          p_Var5[2]._M_next = (_List_node_base *)CONCAT71(uStack_57,local_58);
          p_Var5[2]._M_prev = p_Stack_50;
        }
        else {
          p_Var5[1]._M_next = (_List_node_base *)local_68;
          p_Var5[2]._M_next = (_List_node_base *)CONCAT71(uStack_57,local_58);
        }
        p_Var5[1]._M_prev = local_60;
        local_60 = (_List_node_base *)0x0;
        local_58 = 0;
        local_68 = (FILE *)&stack0xffffffffffffffa8;
        std::__detail::_List_node_base::_M_hook(p_Var5);
        psVar2 = &(pCVar7->inFileList).
                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl._M_node._M_size;
        *psVar2 = *psVar2 + 1;
        this = (CommandOptions *)local_68;
        if (local_68 != (FILE *)&stack0xffffffffffffffa8) {
          operator_delete(local_68,CONCAT71(uStack_57,local_58) + 1);
        }
      }
      bVar9 = pcVar8 < local_40;
      pcVar6 = local_48 + (long)pcVar8;
      pcVar8 = pcVar8 + 1;
    } while (pcVar6 != (char *)0x1);
  }
  if ((pCVar7->help_flag == false) && (*local_70 == false)) {
    if ((pFVar1->
        super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl._M_node.super__List_node_base._M_next == (_List_node_base *)pFVar1) {
      CommandOptions(this);
    }
    else {
      pCVar7->error_flag = false;
    }
  }
  return;
}

Assistant:

CommandOptions(int argc, const char** argv) :
     error_flag(true), version_flag(false), help_flag(false),
     verbose_flag(false), read_mxf_flag(false), walk_parts_flag(false),
     allow_skip_flag(false)
   {
     for ( int i = 1; i < argc; i++ )
       {

	 if ( (strcmp( argv[i], "-help") == 0) )
	   {
	     help_flag = true;
	     continue;
	   }
         
	 if ( argv[i][0] == '-' && isalpha(argv[i][1]) && argv[i][2] == 0 )
	   {
	     switch ( argv[i][1] )
	       {
	       case 'h': help_flag = true; break;
	       case 'r': read_mxf_flag = true; break;
	       case 'p': walk_parts_flag = true; break;
               case 's': allow_skip_flag = true; break;
	       case 'V': version_flag = true; break;
	       case 'v': verbose_flag = true; break;

	       default:
		 fprintf(stderr, "Unrecognized option: %s\n", argv[i]);
		 return;
	       }
	   }
	 else
	   {
	     if ( argv[i][0] != '-' )
	       inFileList.push_back(argv[i]);

	     else
	       {
       	         fprintf(stderr, "Unrecognized option: %s\n", argv[i]);
		 return;
	       }
	   }
       }

     if ( help_flag || version_flag )
       return;
     
     if ( inFileList.empty() )
       {
	 fputs("Input filename(s) required.\n", stderr);
	 return;
       }
     
     error_flag = false;
   }